

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathVec.h
# Opt level: O2

Vec3<float> __thiscall Imath_2_5::Vec3<float>::normalized(Vec3<float> *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  Vec3<float> *in_RSI;
  undefined4 extraout_XMM0_Db;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar6;
  Vec3<float> VVar7;
  
  VVar7.x = length(in_RSI);
  VVar7.y = (float)extraout_XMM0_Db;
  uVar3 = 0;
  fVar6 = 0.0;
  if ((VVar7.x != 0.0) || (NAN(VVar7.x))) {
    uVar1 = in_RSI->x;
    uVar2 = in_RSI->y;
    auVar4._4_4_ = uVar2;
    auVar4._0_4_ = uVar1;
    auVar4._8_8_ = 0;
    auVar5._4_4_ = VVar7.x;
    auVar5._0_4_ = VVar7.x;
    auVar5._8_4_ = VVar7.x;
    auVar5._12_4_ = VVar7.x;
    auVar5 = divps(auVar4,auVar5);
    uVar3 = auVar5._0_8_;
    fVar6 = in_RSI->z / VVar7.x;
  }
  this->z = fVar6;
  this->x = (float)(int)uVar3;
  this->y = (float)(int)((ulong)uVar3 >> 0x20);
  VVar7.z = (float)uVar3;
  return VVar7;
}

Assistant:

Vec3<T>
Vec3<T>::normalized () const
{
    T l = length();

    if (l == T (0))
	return Vec3 (T (0));

    return Vec3 (x / l, y / l, z / l);
}